

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invoke.cpp
# Opt level: O3

void internal_invokegen_ok(Am_Object *valinvokegen_window)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Am_Value *pAVar4;
  Am_Value_List *this;
  ostream *poVar5;
  Am_Wrapper *pAVar6;
  Am_Slot_Key AVar7;
  Am_Object *prev;
  Am_Object execute_command;
  Am_Object create_cmd;
  int placeholder_cnt;
  Am_Object proto;
  Am_Object invoke_window;
  Am_Object script_line;
  Am_Object script_window;
  Am_Object match_command;
  Am_Value_List part_chain;
  Am_Value_List placeholder_list;
  Am_Value old_val;
  Am_Value_List sel_list;
  Am_Value new_value;
  Am_Object new_ph;
  
  pAVar4 = Am_Object::Get(valinvokegen_window,Am_INVOKE_MATCH_COMMAND,0);
  Am_Object::Am_Object(&match_command,pAVar4);
  pAVar4 = Am_Object::Get(valinvokegen_window,Am_SCRIPT_WINDOW,0);
  Am_Object::Am_Object(&invoke_window,pAVar4);
  pAVar4 = Am_Object::Get(&invoke_window,Am_SCRIPT_WINDOW,0);
  Am_Object::Am_Object(&script_window,pAVar4);
  pAVar4 = Am_Object::Get(valinvokegen_window,0xc5,0);
  Am_Value_List::Am_Value_List(&sel_list,pAVar4);
  pAVar4 = Am_Object::Get(valinvokegen_window,0xb8,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar4);
  pAVar4 = Am_Object::Get(&script_window,Am_SCRIPT_EXECUTE_COMMAND,0);
  Am_Object::Am_Object(&execute_command,pAVar4);
  AVar7 = (Am_Slot_Key)valinvokegen_window;
  Am_Object::Get_Object((Am_Object *)&new_value,AVar7,(ulong)Am_UNDO_OPTIONS);
  pAVar4 = Am_Object::Get((Am_Object *)&new_value,0x169,0);
  iVar3 = Am_Value::operator_cast_to_int(pAVar4);
  Am_Object::~Am_Object((Am_Object *)&new_value);
  Am_Value_List::Am_Value_List(&part_chain);
  proto.data = (Am_Object_Data *)0x0;
  pAVar4 = Am_Value_List::Get_First(&sel_list);
  Am_Object::Am_Object(&script_line,pAVar4);
  pAVar4 = Am_Object::Get(&script_line,0xc5,0);
  Am_Object::Am_Object(&create_cmd,pAVar4);
  Am_Object::Get_Object((Am_Object *)&new_value,AVar7,(ulong)Am_CONSTANT_OBJECTS_WIDGET);
  pAVar4 = Am_Object::Get((Am_Object *)&new_value,0xfa,0);
  Am_Value::Am_Value(&old_val,pAVar4);
  Am_Object::~Am_Object((Am_Object *)&new_value);
  pAVar4 = Am_Object::Get(&execute_command,Am_PLACEHOLDER_LIST,0);
  Am_Value_List::Am_Value_List(&placeholder_list,pAVar4);
  pAVar4 = Am_Object::Get(&execute_command,Am_PLACEHOLDER_COUNT,0);
  placeholder_cnt = Am_Value::operator_cast_to_int(pAVar4);
  if (iVar3 < 6) {
    if (iVar3 == 1) {
      prev = &Am_Constant_Placeholder;
    }
    else {
      if (iVar3 != 4) goto LAB_001ffc09;
      Am_Object::Get_Object((Am_Object *)&new_value,AVar7,(ulong)Am_ALL_FROM_COMMAND_WIDGET);
      pAVar4 = Am_Object::Get((Am_Object *)&new_value,0xfa,3);
      Am_Object::operator=(&create_cmd,pAVar4);
      Am_Object::~Am_Object((Am_Object *)&new_value);
      bVar1 = Am_Object::Valid(&create_cmd);
      if (!bVar1) {
        std::ostrstream::ostrstream((ostrstream *)&new_value,(char *)&new_ph,0xfa,_S_out);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&new_value,"Command not filled in.",0x16);
        std::ostream::put((char)&new_value);
        Am_Pop_Up_Error_Window((char *)&new_ph);
        std::ostrstream::~ostrstream((ostrstream *)&new_value);
        goto LAB_001ffb13;
      }
      prev = &Am_All_Values_From_Command_Placeholder;
    }
  }
  else if (iVar3 == 0x1f) {
    Am_Object::Get_Object((Am_Object *)&new_value,AVar7,(ulong)Am_TYPE_OBJECTS_WIDGET);
    pAVar4 = Am_Object::Get((Am_Object *)&new_value,0x169,0);
    this = Am_Value_List::Add(&part_chain,pAVar4,Am_TAIL,true);
    Am_Object::Get_Object(&new_ph,AVar7,(ulong)Am_TYPE_OBJECTS_WIDGET);
    pAVar4 = Am_Object::Get(&new_ph,0xfa,0);
    Am_Value_List::Add(this,pAVar4,Am_TAIL,true);
    Am_Object::~Am_Object(&new_ph);
    Am_Object::~Am_Object((Am_Object *)&new_value);
    prev = &Am_Type_Match_Placeholder;
  }
  else {
    if (iVar3 != 0x20) {
      if (iVar3 == 6) {
        Am_Error("Custom not yet implemented");
      }
LAB_001ffc09:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"** Amulet_Error: ",0x11);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Bad type ",9);
      poVar5 = (ostream *)std::ostream::operator<<(&std::cerr,iVar3);
      std::endl<char,std::char_traits<char>>(poVar5);
      Am_Error();
    }
    gen_any_value_header(&old_val,&part_chain,(Am_Slot_Key)iVar2);
    prev = &Am_Any_Value_Placeholder;
  }
  Am_Object::operator=(&proto,prev);
  Am_Object::Am_Object((Am_Object *)&stack0xfffffffffffffd00,&proto);
  am_call_create_placeholder
            (&new_ph,(Am_Value *)&stack0xfffffffffffffd00,(Am_Object *)&old_val,
             (Am_Value_List *)&create_cmd,&placeholder_list,(int *)&part_chain,
             (Am_Slot_Key)&placeholder_cnt);
  Am_Object::~Am_Object((Am_Object *)&stack0xfffffffffffffd00);
  AVar7 = Am_LOCATION_PLACEHOLDER;
  pAVar4 = Am_Object::Get(valinvokegen_window,Am_LOCATION_PLACEHOLDER,3);
  Am_Object::Set(&new_ph,AVar7,pAVar4,1);
  if (am_sdebug == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"valinvokegen: New placeholder is ",0x21);
    poVar5 = operator<<((ostream *)&std::cout,&new_ph);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    std::ostream::flush();
  }
  AVar7 = Am_PLACEHOLDER_LIST;
  pAVar6 = Am_Value_List::operator_cast_to_Am_Wrapper_(&placeholder_list);
  Am_Object::Set(&execute_command,AVar7,pAVar6,0);
  Am_Object::Set(&execute_command,Am_PLACEHOLDER_COUNT,placeholder_cnt,0);
  new_value.type = 0;
  new_value.value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar6 = Am_Object::operator_cast_to_Am_Wrapper_(&new_ph);
  Am_Value::operator=(&new_value,pAVar6);
  am_script_replace_all(&sel_list,&new_value,&invoke_window,(Am_Slot_Key)iVar2,&match_command);
  Am_Value::~Am_Value(&new_value);
  Am_Object::~Am_Object(&new_ph);
LAB_001ffb13:
  Am_Value_List::~Am_Value_List(&placeholder_list);
  Am_Value::~Am_Value(&old_val);
  Am_Object::~Am_Object(&create_cmd);
  Am_Object::~Am_Object(&script_line);
  Am_Object::~Am_Object(&proto);
  Am_Value_List::~Am_Value_List(&part_chain);
  Am_Object::~Am_Object(&execute_command);
  Am_Value_List::~Am_Value_List(&sel_list);
  Am_Object::~Am_Object(&script_window);
  Am_Object::~Am_Object(&invoke_window);
  Am_Object::~Am_Object(&match_command);
  return;
}

Assistant:

void
internal_invokegen_ok(Am_Object &valinvokegen_window)
{
  Am_Object match_command = valinvokegen_window.Get(Am_INVOKE_MATCH_COMMAND);
  Am_Object invoke_window = valinvokegen_window.Get(Am_SCRIPT_WINDOW);
  Am_Object script_window = invoke_window.Get(Am_SCRIPT_WINDOW);
  Am_Value_List sel_list = valinvokegen_window.Get(Am_COMMAND);
  Am_Slot_Key slot =
      (Am_Slot_Key)(int)valinvokegen_window.Get(Am_SLOTS_TO_SAVE);
  Am_Object execute_command = script_window.Get(Am_SCRIPT_EXECUTE_COMMAND);
  int how_gen = valinvokegen_window.Get_Object(Am_UNDO_OPTIONS).Get(Am_VALUE);
  Am_Value_List part_chain;
  Am_Object proto;
  Am_Object script_line = sel_list.Get_First();
  Am_Object create_cmd = script_line.Get(Am_COMMAND);
  Am_Value old_val =
      valinvokegen_window.Get_Object(Am_CONSTANT_OBJECTS_WIDGET).Get(Am_VALUES);

  Am_Value_List placeholder_list = execute_command.Get(Am_PLACEHOLDER_LIST);
  int placeholder_cnt = execute_command.Get(Am_PLACEHOLDER_COUNT);
  switch (how_gen) {
  case am_constant_generalize:
    proto = Am_Constant_Placeholder;
    break;
  case am_type_generalize:
    part_chain
        .Add(valinvokegen_window.Get_Object(Am_TYPE_OBJECTS_WIDGET)
                 .Get(Am_VALUE))
        .Add(valinvokegen_window.Get_Object(Am_TYPE_OBJECTS_WIDGET)
                 .Get(Am_VALUES));
    proto = Am_Type_Match_Placeholder;
    break;
  case am_any_value_generalize:
    gen_any_value_header(old_val, part_chain, slot);
    proto = Am_Any_Value_Placeholder;
    break;
  case am_all_values_generalize:
    create_cmd = valinvokegen_window.Get_Object(Am_ALL_FROM_COMMAND_WIDGET)
                     .Get(Am_VALUES, Am_RETURN_ZERO_ON_ERROR);
    if (!create_cmd.Valid()) {
      AM_POP_UP_ERROR_WINDOW("Command not filled in.");
      return; //don't finish with this window
    }
    proto = Am_All_Values_From_Command_Placeholder;
    break;
  case am_custom_generalize: {
    Am_Error("Custom not yet implemented");
    break;
  }
  default:
    Am_ERROR("Bad type " << how_gen);
  } //end switch

  Am_Object new_ph =
      am_call_create_placeholder(proto, old_val, create_cmd, placeholder_list,
                                 part_chain, placeholder_cnt, slot);
  //needed if placeholder for location
  new_ph.Set(
      Am_LOCATION_PLACEHOLDER,
      valinvokegen_window.Get(Am_LOCATION_PLACEHOLDER, Am_RETURN_ZERO_ON_ERROR),
      Am_OK_IF_NOT_THERE);
  if (am_sdebug)
    std::cout << "valinvokegen: New placeholder is " << new_ph << std::endl
              << std::flush;
  execute_command.Set(Am_PLACEHOLDER_LIST, placeholder_list);
  execute_command.Set(Am_PLACEHOLDER_COUNT, placeholder_cnt);
  Am_Value new_value;
  new_value = new_ph;
  am_script_replace_all(sel_list, new_value, invoke_window, slot,
                        match_command);
}